

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::Grow(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
       *this)

{
  size_t sVar1;
  optional<std::pair<int,_int>_> *poVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  newTable;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  vStack_38;
  polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_> local_18;
  
  sVar1 = (this->table).nStored;
  sVar3 = 0x40;
  if (0x40 < sVar1 * 2) {
    sVar3 = sVar1 * 2;
  }
  local_18.memoryResource = (this->table).alloc.memoryResource;
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::vector(&vStack_38,sVar3,&local_18);
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      poVar2 = (this->table).ptr;
      if (poVar2[sVar3].set == true) {
        uVar5 = 0;
        do {
          iVar4 = (int)uVar5;
          uVar6 = (ulong)((uint)(iVar4 * iVar4) >> 1) +
                  (uVar5 >> 1) +
                  ((long)(int)poVar2[sVar3].optionalValue.__align & vStack_38.nStored - 1) &
                  vStack_38.nStored - 1;
          uVar5 = (ulong)(iVar4 + 1);
        } while (vStack_38.ptr[uVar6].set != false);
        poVar2 = (this->table).ptr;
        if (poVar2[sVar3].set == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        vStack_38.ptr[uVar6].optionalValue = poVar2[sVar3].optionalValue;
        vStack_38.ptr[uVar6].set = true;
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar1);
  }
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::operator=(&this->table,&vStack_38);
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::~vector(&vStack_38);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }